

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

bool decompressHigu(vector<unsigned_char,_std::allocator<unsigned_char>_> *output,uint8_t *input,
                   int inputLength,bool isSwitch)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  puVar3 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  uVar9 = 1;
  iVar7 = 0;
  while( true ) {
    if (inputLength <= iVar7) {
      return true;
    }
    if ((int)uVar9 == 1) {
      lVar5 = (long)iVar7;
      iVar7 = iVar7 + 1;
      uVar9 = (ulong)(input[lVar5] | 0x100);
    }
    if (inputLength <= iVar7) break;
    if ((uVar9 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(output,input + iVar7);
      iVar7 = iVar7 + 1;
    }
    else {
      iVar8 = iVar7 + 2;
      if (inputLength < iVar8) {
        return false;
      }
      bVar1 = input[iVar7];
      bVar2 = input[(long)iVar7 + 1];
      bVar4 = bVar1 << 4 | bVar1 >> 4;
      if (!isSwitch) {
        bVar4 = bVar1;
      }
      iVar6 = (bVar4 & 0xf) + 3;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, iVar7 = iVar8, bVar10) {
        puVar3 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        lVar5 = (long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(puVar3 + ((uint)bVar2 + (bVar4 & 0xf0) * 0x10 + 1));
        if (lVar5 < 0) {
          return false;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(output,puVar3 + lVar5)
        ;
      }
    }
    uVar9 = uVar9 >> 1;
  }
  return true;
}

Assistant:

bool decompressHigu(std::vector<uint8_t> &output, const uint8_t *input, int inputLength, bool isSwitch) {
	int marker = 1;
	int p = 0;

	output.clear();

	while (p < inputLength) {
		if (marker == 1) {
			marker = 0x100 | input[p++];
		}

		if (p >= inputLength) {
			break;
		}

		if (marker & 1) {
			if (p + 2 > inputLength) {
				return false;
			}
			uint8_t b1 = input[p++];
			uint8_t b2 = input[p++];

			if (isSwitch) {
				b1 = (b1 >> 4) | (b1 << 4);
			}

			int count = (b1 & 0x0F) + 3;
			int offset = ((b1 & 0xF0) << 4) | b2;

			for (int i = 0; i < count; i++) {
				ptrdiff_t index = output.size() - (offset + 1);
				if (index < 0) {
					return false;
				}
				output.push_back(output[index]);
			}
		}
		else {
			output.push_back(input[p++]);
		}

		marker >>= 1;
	}
	return true;
}